

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_tests.cpp
# Opt level: O0

void span_tests::span_constructor_sfinae_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  span_constructor_sfinae t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff608;
  std_string *in_stack_fffffffffffff610;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff618;
  const_string *in_stack_fffffffffffff630;
  const_string *msg;
  size_t in_stack_fffffffffffff638;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff640;
  unit_test_log_t *in_stack_fffffffffffff648;
  span_constructor_sfinae *in_stack_fffffffffffff750;
  undefined1 local_800 [408];
  undefined1 local_668 [408];
  undefined1 local_4d0 [408];
  undefined1 local_338 [408];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [24])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_338,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [24])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [16])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::setup_conditional<span_tests::span_constructor_sfinae>
            ((span_constructor_sfinae *)0xaf6ebd);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_4d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [24])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [13])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  span_constructor_sfinae::test_method(in_stack_fffffffffffff750);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [24])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [19])in_stack_fffffffffffff610);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::teardown_conditional<span_tests::span_constructor_sfinae>
            ((span_constructor_sfinae *)0xaf70f8);
  msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  __s = local_800;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  file = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [24])in_stack_fffffffffffff610);
  this_00 = boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)__s,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(span_constructor_sfinae)
{
    BOOST_CHECK(Spannable(std::vector<int>{}));
    BOOST_CHECK(!Spannable(std::set<int>{}));
    BOOST_CHECK(!Spannable(std::vector<bool>{}));
    BOOST_CHECK(Spannable(std::array<int, 3>{}));
    BOOST_CHECK(Spannable(Span<int>{}));
    BOOST_CHECK(Spannable("char array"));
    BOOST_CHECK(Spannable(SpannableYes{}));
    BOOST_CHECK(!Spannable(SpannableNo{}));
}